

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

bool qtransform_equals_no_translate(QTransform *a,QTransform *b)

{
  TransformationType TVar1;
  QTransform *in_RSI;
  QTransform *in_RDI;
  qreal qVar2;
  qreal qVar3;
  QTransform *in_stack_ffffffffffffffc8;
  bool local_19;
  
  TVar1 = QTransform::type(in_stack_ffffffffffffffc8);
  if (((int)TVar1 < 2) && (TVar1 = QTransform::type(in_stack_ffffffffffffffc8), (int)TVar1 < 2)) {
    return true;
  }
  qVar2 = QTransform::m11(in_RDI);
  qVar3 = QTransform::m11(in_RSI);
  local_19 = false;
  if ((qVar2 == qVar3) && (!NAN(qVar2) && !NAN(qVar3))) {
    qVar2 = QTransform::m12(in_RDI);
    qVar3 = QTransform::m12(in_RSI);
    local_19 = false;
    if ((qVar2 == qVar3) && (!NAN(qVar2) && !NAN(qVar3))) {
      qVar2 = QTransform::m21(in_RDI);
      qVar3 = QTransform::m21(in_RSI);
      local_19 = false;
      if ((qVar2 == qVar3) && (!NAN(qVar2) && !NAN(qVar3))) {
        qVar2 = QTransform::m22(in_RDI);
        qVar3 = QTransform::m22(in_RSI);
        local_19 = qVar2 == qVar3;
      }
    }
  }
  return local_19;
}

Assistant:

static inline bool qtransform_equals_no_translate(const QTransform &a, const QTransform &b)
{
    if (a.type() <= QTransform::TxTranslate && b.type() <= QTransform::TxTranslate) {
        return true;
    } else {
        // We always use paths for perspective text anyway, so no
        // point in checking the full matrix...
        Q_ASSERT(a.type() < QTransform::TxProject);
        Q_ASSERT(b.type() < QTransform::TxProject);

        return a.m11() == b.m11()
            && a.m12() == b.m12()
            && a.m21() == b.m21()
            && a.m22() == b.m22();
    }
}